

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GoalSymbol.h
# Opt level: O2

void __thiscall GoalSymbol::set_type(GoalSymbol *this,TypeSpec *ts)

{
  pointer pcVar1;
  bool bVar2;
  string local_60;
  string local_40;
  
  if (this->m_has_type_info == true) {
    bVar2 = TypeSpec::operator!=(ts,&this->m_type);
    if (bVar2) {
      pcVar1 = (this->m_name)._M_dataplus._M_p;
      TypeSpec::to_string_abi_cxx11_(&local_60,&this->m_type);
      TypeSpec::to_string_abi_cxx11_(&local_40,ts);
      printf("symbol %s %s -> %s",pcVar1,local_60._M_dataplus._M_p,local_40._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&local_60);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/TypeSystem/GoalSymbol.h"
                    ,0x18,"void GoalSymbol::set_type(TypeSpec)");
    }
  }
  this->m_has_type_info = true;
  TypeSpec::operator=(&this->m_type,ts);
  return;
}

Assistant:

void set_type(TypeSpec ts) {
    if(m_has_type_info) {
      if(ts != m_type) {
        printf("symbol %s %s -> %s", m_name.c_str(), m_type.to_string().c_str(), ts.to_string().c_str());
        assert(false);
      }
    }

    m_has_type_info = true;
    m_type = std::move(ts);
  }